

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O3

bool instMatchesCrit(Instruction *I,string *fun,uint line,string *obj,LLVMPointerAnalysis *pta)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  raw_ostream *prVar8;
  bool bVar9;
  LLVMPointerAnalysis *pta_00;
  _Alloc_hider _Var10;
  bool bVar11;
  undefined1 auVar12 [16];
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar13;
  StringRef Str;
  StringRef Str_00;
  string objname;
  string local_78;
  LLVMPointerAnalysis *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_58 = pta;
  if (fun->_M_string_length != 0) {
    auVar12 = llvm::Value::getName();
    lVar7 = auVar12._0_8_;
    paVar1 = &local_78.field_2;
    local_78._M_dataplus._M_p = (pointer)paVar1;
    if (lVar7 == 0) {
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      if (fun->_M_string_length != 0) goto LAB_00126f7b;
LAB_00126f88:
      bVar11 = false;
      _Var10._M_p = local_78._M_dataplus._M_p;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,lVar7,auVar12._8_8_ + lVar7);
      _Var10._M_p = local_78._M_dataplus._M_p;
      if (local_78._M_string_length == fun->_M_string_length) {
        if (local_78._M_string_length == 0) goto LAB_00126f88;
        iVar5 = bcmp(local_78._M_dataplus._M_p,(fun->_M_dataplus)._M_p,local_78._M_string_length);
        bVar11 = iVar5 != 0;
      }
      else {
LAB_00126f7b:
        bVar11 = true;
        _Var10._M_p = local_78._M_dataplus._M_p;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var10._M_p != paVar1) {
      operator_delete(_Var10._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
    if (bVar11) {
      return false;
    }
  }
  if ((line != 0) &&
     ((*(long *)(I + 0x30) == 0 || (uVar6 = llvm::DebugLoc::getLine(), uVar6 != line)))) {
    return false;
  }
  if (obj->_M_string_length == 0) {
    return true;
  }
  cVar2 = *(obj->_M_dataplus)._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  if (cVar2 == '&') {
    std::__cxx11::string::substr((ulong)local_50,(ulong)obj);
    std::__cxx11::string::operator=((string *)&local_78,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_78);
  }
  cVar3 = *local_78._M_dataplus._M_p;
  if (cVar3 == '@') {
    std::__cxx11::string::substr((ulong)local_50,(ulong)obj);
    std::__cxx11::string::operator=((string *)&local_78,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  if ((local_78._M_string_length < 3) ||
     (iVar5 = std::__cxx11::string::compare
                        ((ulong)&local_78,local_78._M_string_length - 2,(char *)0x2), iVar5 != 0)) {
    pta_00 = local_58;
    if (cVar2 != '&') {
      bVar11 = false;
      goto LAB_001270cc;
    }
LAB_001270e5:
    bVar11 = usesTheVariable(I,&local_78,cVar3 == '@',pta_00);
    bVar9 = true;
    if (bVar11) goto LAB_00127105;
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,(ulong)&local_78);
    std::__cxx11::string::operator=((string *)&local_78,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    bVar11 = true;
    if (cVar2 == '&') {
      if (instMatchesCrit(llvm::Instruction_const&,std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&,dg::LLVMPointerAnalysis*)
          ::reported_abi_cxx11_ == '\0') {
        instMatchesCrit();
      }
      pVar13 = std::
               _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::_M_insert_unique<std::__cxx11::string_const&>
                         ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)&instMatchesCrit(llvm::Instruction_const&,std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&,dg::LLVMPointerAnalysis*)
                              ::reported_abi_cxx11_,obj);
      if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        prVar8 = (raw_ostream *)llvm::errs();
        Str.Length = 0x42;
        Str.Data = "ERROR: ignoring invalid criterion (var and func at the same time: ";
        prVar8 = llvm::raw_ostream::operator<<(prVar8,Str);
        prVar8 = (raw_ostream *)
                 llvm::raw_ostream::write((char *)prVar8,(ulong)(obj->_M_dataplus)._M_p);
        Str_00.Length = 1;
        Str_00.Data = "\n";
        llvm::raw_ostream::operator<<(prVar8,Str_00);
      }
    }
    else {
LAB_001270cc:
      pta_00 = local_58;
      bVar4 = instIsCallOf(I,&local_78,local_58);
      bVar9 = true;
      if (bVar4) goto LAB_00127105;
      if (!bVar11) goto LAB_001270e5;
    }
  }
  bVar9 = false;
LAB_00127105:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
    return bVar9;
  }
  return bVar9;
}

Assistant:

static bool instMatchesCrit(const llvm::Instruction &I, const std::string &fun,
                            unsigned line, const std::string &obj,
                            LLVMPointerAnalysis *pta = nullptr) {
    // function match?
    if (!fun.empty() && I.getParent()->getParent()->getName().str() != fun)
        return false;

    // line match?
    if (line > 0) {
        const auto &Loc = I.getDebugLoc();
#if (LLVM_VERSION_MAJOR == 3 && LLVM_VERSION_MINOR < 7)
        if (Loc.getLine() != line)
#else
        if (!Loc || line != Loc.getLine())
#endif
        {
            return false;
        }
    }

    if (obj.empty()) {
        // we passed the line check and we have no obj to check
        return true;
    }

    // TODO: allow speficy namespaces, not only global/non-global
    bool isvar = obj[0] == '&';
    std::string objname;
    if (isvar) {
        objname = obj.substr(1);
    } else {
        objname = obj;
    }

    bool isglobal = objname[0] == '@';
    if (isglobal) {
        objname = obj.substr(1);
    }

    auto len = objname.length();
    bool isfunc = len > 2 && objname.compare(len - 2, 2, "()") == 0;
    if (isfunc) {
        objname = objname.substr(0, len - 2);
    }

    if (isvar && isfunc) {
        static std::set<std::string> reported;
        if (reported.insert(obj).second) {
            llvm::errs() << "ERROR: ignoring invalid criterion (var and func "
                            "at the same time: "
                         << obj << "\n";
        }
        return false;
    }

    // obj match?
    if (!isvar && instIsCallOf(I, objname, pta)) {
        return true;
    } // else fall through to check the vars

    if (!isfunc && usesTheVariable(I, objname, isglobal, pta)) {
        return true;
    }

    return false;
}